

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void set_game_window_attributes(tgestate_t *state,attribute_t attrs)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  attribute_t *__s;
  char cVar4;
  
  __s = (state->speccy->screen).attributes + 0x47;
  iVar1 = state->width;
  iVar2 = state->columns;
  cVar4 = (char)state->rows + -1;
  do {
    uVar3 = (ulong)(byte)((char)state->columns - 2);
    memset(__s,(uint)attrs,uVar3 + 1);
    __s = __s + (ulong)((iVar1 - iVar2) + 1U & 0xffff) + uVar3 + 1;
    cVar4 = cVar4 + -1;
  } while (cVar4 != '\0');
  invalidate_attrs(state,(state->speccy->screen).attributes + 0x47,state->columns << 3,
                   state->rows * 8 + -8);
  return;
}

Assistant:

void set_game_window_attributes(tgestate_t *state, attribute_t attrs)
{
  attribute_t *attributes; /* was HL */
  uint8_t      rows;       /* was C */
  uint16_t     stride;     /* was DE */

  assert(state != NULL);
  assert(attrs >= attribute_BLUE_OVER_BLACK && attrs <= attribute_BRIGHT_WHITE_OVER_BLACK);

  attributes = &state->speccy->screen.attributes[0x0047];
  rows   = state->rows - 1;
  stride = state->width - (state->columns - 1); /* e.g. 32 - 23 = 9 */
  do
  {
    uint8_t iters;

    iters = state->columns - 1; /* e.g. 23 */
    do
      *attributes++ = attrs;
    while (--iters);
    attributes += stride;
  }
  while (--rows);

  /* Conv: Invalidation added over the original game. */
  invalidate_attrs(state,
                   &state->speccy->screen.attributes[0x0047],
                   state->columns * 8,
                   (state->rows - 1) * 8);
}